

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall TypeTest_ModuleTypePrinter_Test::TestBody(TypeTest_ModuleTypePrinter_Test *this)

{
  Printed PVar1;
  Printed PVar2;
  Printed PVar3;
  Printed PVar4;
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  bool bVar5;
  char *pcVar6;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  reference pvVar7;
  mapped_type *this_00;
  char *in_R9;
  Entry EVar8;
  undefined8 in_stack_fffffffffffff408;
  undefined8 in_stack_fffffffffffff410;
  undefined7 in_stack_fffffffffffff418;
  undefined1 in_stack_fffffffffffff41f;
  undefined8 in_stack_fffffffffffff420;
  ostream *poVar9;
  _Invoker_type in_stack_fffffffffffff428;
  allocator<char> *__a;
  AssertHelper local_b10;
  Message local_b08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b00;
  undefined1 local_ae0 [8];
  AssertionResult gtest_ar_3;
  Printed local_ac8;
  allocator<char> local_a99;
  string local_a98 [32];
  AssertHelper local_a78;
  Message local_a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  undefined1 local_a48 [8];
  AssertionResult gtest_ar_2;
  Printed local_a30;
  allocator<char> local_a01;
  string local_a00 [32];
  undefined1 local_9e0 [8];
  ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
  printIndexed;
  string local_970;
  undefined1 local_950 [8];
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> fallback;
  Message local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  undefined1 local_888 [8];
  AssertionResult gtest_ar_1;
  Printed local_870;
  allocator<char> local_841;
  string local_840 [32];
  AssertHelper local_820;
  Message local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  undefined1 local_7f0 [8];
  AssertionResult gtest_ar;
  Printed local_7d8;
  stringstream local_7b0 [8];
  stringstream stream;
  ostream local_7a0 [376];
  undefined1 local_628 [8];
  ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator> printDefault;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  local_5b0;
  undefined1 local_578 [8];
  Module module;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  string local_168;
  AssertHelper local_148;
  Message local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  allocator<wasm::Field> local_f1;
  Type local_f0;
  Field local_e8;
  iterator local_d8;
  size_type local_d0;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_c8;
  Struct local_b0;
  Entry local_98;
  allocator<wasm::Field> local_81;
  Type local_80;
  Field local_78;
  iterator local_68;
  size_type local_60;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_58;
  Struct local_40;
  TypeBuilder local_18;
  TypeBuilder builder;
  TypeTest_ModuleTypePrinter_Test *this_local;
  
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)this;
  ::wasm::TypeBuilder::TypeBuilder(&local_18,2);
  ::wasm::TypeBuilder::createRecGroup((ulong)&local_18,0);
  ::wasm::Type::Type(&local_80,i32);
  ::wasm::Field::Field(&local_78,local_80,Immutable);
  local_68 = &local_78;
  local_60 = 1;
  std::allocator<wasm::Field>::allocator(&local_81);
  __l_00._M_len = local_60;
  __l_00._M_array = local_68;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_58,__l_00,&local_81);
  ::wasm::Struct::Struct(&local_40,&local_58);
  local_98 = ::wasm::TypeBuilder::operator[](&local_18,0);
  ::wasm::TypeBuilder::Entry::operator=(&local_98,&local_40);
  ::wasm::Struct::~Struct(&local_40);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_58);
  std::allocator<wasm::Field>::~allocator(&local_81);
  ::wasm::Type::Type(&local_f0,i32);
  ::wasm::Field::Field(&local_e8,local_f0,Immutable);
  local_d8 = &local_e8;
  local_d0 = 1;
  std::allocator<wasm::Field>::allocator(&local_f1);
  __l._M_len = local_d0;
  __l._M_array = local_d8;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_c8,__l,&local_f1);
  ::wasm::Struct::Struct(&local_b0,&local_c8);
  EVar8 = ::wasm::TypeBuilder::operator[](&local_18,1);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar8.builder;
  ::wasm::TypeBuilder::Entry::operator=
            ((Entry *)((long)&result.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      + 0x18),&local_b0);
  ::wasm::Struct::~Struct(&local_b0);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_c8);
  std::allocator<wasm::Field>::~allocator(&local_f1);
  ::wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_138,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar5) {
    testing::Message::Message(&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_168,(internal *)local_138,(AssertionResult *)0x4945b1,"false","true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x87,pcVar6);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  if (bVar5) {
    __x = ::wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &module.tagsMap._M_h._M_single_bucket,__x);
    ::wasm::Module::Module((Module *)local_578);
    ::wasm::Name::Name((Name *)&printDefault.fallback,"A");
    local_5b0._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    local_5b0._M_h._M_rehash_policy._4_4_ = 0;
    local_5b0._M_h._M_rehash_policy._M_next_resize = 0;
    local_5b0._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_5b0._M_h._M_element_count = 0;
    local_5b0._M_h._M_buckets = (__buckets_ptr)0x0;
    local_5b0._M_h._M_bucket_count = 0;
    local_5b0._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::
    unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
    ::unordered_map(&local_5b0);
    pvVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &module.tagsMap._M_h._M_single_bucket,0);
    this_00 = std::
              unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
              ::operator[]((unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                            *)&module.name.super_IString.str._M_str,pvVar7);
    ::wasm::TypeNames::operator=(this_00,(TypeNames *)&printDefault.fallback);
    ::wasm::TypeNames::~TypeNames((TypeNames *)&printDefault.fallback);
    ::wasm::ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
    ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator>
              ((ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_628,
               (Module *)local_578,
               (enable_if_t<std::is_same_v<wasm::DefaultTypeNameGenerator,_DefaultTypeNameGenerator>_>
                *)0x0);
    std::__cxx11::stringstream::stringstream(local_7b0);
    pvVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &module.tagsMap._M_h._M_single_bucket,0);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )pvVar7->id;
    ::wasm::TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
    operator()(&local_7d8,
               (TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                *)local_628,
               (HeapType)
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
    PVar1.generateName.super__Function_base._M_functor._M_unused._M_object =
         (void *)in_stack_fffffffffffff410;
    PVar1.typeID = in_stack_fffffffffffff408;
    PVar1.generateName.super__Function_base._M_functor._8_7_ = in_stack_fffffffffffff418;
    PVar1.generateName.super__Function_base._M_functor._M_pod_data[0xf] = in_stack_fffffffffffff41f;
    PVar1.generateName.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffff420;
    PVar1.generateName._M_invoker = in_stack_fffffffffffff428;
    ::wasm::operator<<(local_7a0,PVar1);
    ::wasm::HeapType::Printed::~Printed(&local_7d8);
    std::__cxx11::stringstream::str();
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[31],_nullptr>
              ((EqHelper *)local_7f0,"stream.str()","\"(type $A (struct (field i32)))\"",&local_810,
               (char (*) [31])"(type $A (struct (field i32)))");
    std::__cxx11::string::~string((string *)&local_810);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f0);
    if (!bVar5) {
      testing::Message::Message(&local_818);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_7f0);
      testing::internal::AssertHelper::AssertHelper
                (&local_820,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x91,pcVar6);
      testing::internal::AssertHelper::operator=(&local_820,&local_818);
      testing::internal::AssertHelper::~AssertHelper(&local_820);
      testing::Message::~Message(&local_818);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_840,"",&local_841);
    std::__cxx11::stringstream::str((string *)local_7b0);
    std::__cxx11::string::~string(local_840);
    std::allocator<char>::~allocator(&local_841);
    pvVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &module.tagsMap._M_h._M_single_bucket,1);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )pvVar7->id;
    ::wasm::TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
    operator()(&local_870,
               (TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                *)local_628,
               (HeapType)
               gtest_ar_1.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
    PVar2.generateName.super__Function_base._M_functor._M_unused._M_object =
         (void *)in_stack_fffffffffffff410;
    PVar2.typeID = in_stack_fffffffffffff408;
    PVar2.generateName.super__Function_base._M_functor._8_7_ = in_stack_fffffffffffff418;
    PVar2.generateName.super__Function_base._M_functor._M_pod_data[0xf] = in_stack_fffffffffffff41f;
    PVar2.generateName.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffff420;
    PVar2.generateName._M_invoker = in_stack_fffffffffffff428;
    ::wasm::operator<<(local_7a0,PVar2);
    ::wasm::HeapType::Printed::~Printed(&local_870);
    std::__cxx11::stringstream::str();
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[38],_nullptr>
              ((EqHelper *)local_888,"stream.str()","\"(type $struct.0 (struct (field i32)))\"",
               &local_8a8,(char (*) [38])"(type $struct.0 (struct (field i32)))");
    std::__cxx11::string::~string((string *)&local_8a8);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_888);
    if (!bVar5) {
      testing::Message::Message(&local_8b0);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_888);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&fallback.names._M_h._M_single_bucket,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x95,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&fallback.names._M_h._M_single_bucket,&local_8b0);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)&fallback.names._M_h._M_single_bucket);
      testing::Message::~Message(&local_8b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_888);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_970,"",(allocator<char> *)((long)&printIndexed.fallback + 7));
    ::wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
    IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
              ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_950,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &module.tagsMap._M_h._M_single_bucket,&local_970);
    std::__cxx11::string::~string((string *)&local_970);
    std::allocator<char>::~allocator((allocator<char> *)((long)&printIndexed.fallback + 7));
    ::wasm::ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
    ::ModuleTypeNameGenerator
              ((ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                *)local_9e0,(Module *)local_578,
               (IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_950);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_a00,"",&local_a01);
    std::__cxx11::stringstream::str((string *)local_7b0);
    std::__cxx11::string::~string(local_a00);
    std::allocator<char>::~allocator(&local_a01);
    pvVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &module.tagsMap._M_h._M_single_bucket,0);
    gtest_ar_2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )pvVar7->id;
    ::wasm::
    TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
    ::operator()(&local_a30,
                 (TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                  *)local_9e0,
                 (HeapType)
                 gtest_ar_2.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
    PVar3.generateName.super__Function_base._M_functor._M_unused._M_object =
         (void *)in_stack_fffffffffffff410;
    PVar3.typeID = in_stack_fffffffffffff408;
    PVar3.generateName.super__Function_base._M_functor._8_7_ = in_stack_fffffffffffff418;
    PVar3.generateName.super__Function_base._M_functor._M_pod_data[0xf] = in_stack_fffffffffffff41f;
    PVar3.generateName.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffff420;
    PVar3.generateName._M_invoker = in_stack_fffffffffffff428;
    ::wasm::operator<<(local_7a0,PVar3);
    ::wasm::HeapType::Printed::~Printed(&local_a30);
    std::__cxx11::stringstream::str();
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[31],_nullptr>
              ((EqHelper *)local_a48,"stream.str()","\"(type $A (struct (field i32)))\"",&local_a68,
               (char (*) [31])"(type $A (struct (field i32)))");
    std::__cxx11::string::~string((string *)&local_a68);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a48);
    if (!bVar5) {
      testing::Message::Message(&local_a70);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_a48);
      testing::internal::AssertHelper::AssertHelper
                (&local_a78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x9d,pcVar6);
      testing::internal::AssertHelper::operator=(&local_a78,&local_a70);
      testing::internal::AssertHelper::~AssertHelper(&local_a78);
      testing::Message::~Message(&local_a70);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a48);
    __a = &local_a99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_a98,"",__a);
    std::__cxx11::stringstream::str((string *)local_7b0);
    std::__cxx11::string::~string(local_a98);
    std::allocator<char>::~allocator(&local_a99);
    poVar9 = local_7a0;
    pvVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &module.tagsMap._M_h._M_single_bucket,1);
    gtest_ar_3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )pvVar7->id;
    ::wasm::
    TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
    ::operator()(&local_ac8,
                 (TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                  *)local_9e0,
                 (HeapType)
                 gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
    PVar4.generateName.super__Function_base._M_functor._M_unused._M_object =
         (void *)in_stack_fffffffffffff410;
    PVar4.typeID = in_stack_fffffffffffff408;
    PVar4.generateName.super__Function_base._M_functor._8_7_ = in_stack_fffffffffffff418;
    PVar4.generateName.super__Function_base._M_functor._M_pod_data[0xf] = in_stack_fffffffffffff41f;
    PVar4.generateName.super__Function_base._M_manager = (_Manager_type)poVar9;
    PVar4.generateName._M_invoker = (_Invoker_type)__a;
    ::wasm::operator<<(poVar9,PVar4);
    ::wasm::HeapType::Printed::~Printed(&local_ac8);
    std::__cxx11::stringstream::str();
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[31],_nullptr>
              ((EqHelper *)local_ae0,"stream.str()","\"(type $1 (struct (field i32)))\"",&local_b00,
               (char (*) [31])"(type $1 (struct (field i32)))");
    std::__cxx11::string::~string((string *)&local_b00);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae0);
    if (!bVar5) {
      testing::Message::Message(&local_b08);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_ae0);
      testing::internal::AssertHelper::AssertHelper
                (&local_b10,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0xa1,pcVar6);
      testing::internal::AssertHelper::operator=(&local_b10,&local_b08);
      testing::internal::AssertHelper::~AssertHelper(&local_b10);
      testing::Message::~Message(&local_b08);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae0);
    ::wasm::ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
    ::~ModuleTypeNameGenerator
              ((ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                *)local_9e0);
    ::wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::~IndexedTypeNameGenerator
              ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_950);
    std::__cxx11::stringstream::~stringstream(local_7b0);
    ::wasm::ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator>::~ModuleTypeNameGenerator
              ((ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_628);
    ::wasm::Module::~Module((Module *)local_578);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &module.tagsMap._M_h._M_single_bucket);
  }
  ::wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  ::wasm::TypeBuilder::~TypeBuilder(&local_18);
  return;
}

Assistant:

TEST_F(TypeTest, ModuleTypePrinter) {
  TypeBuilder builder(2);
  builder.createRecGroup(0, 2);
  builder[0] = Struct({Field(Type::i32, Immutable)});
  builder[1] = Struct({Field(Type::i32, Immutable)});

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  Module module;
  module.typeNames[built[0]] = {"A", {}};

  ModuleTypeNameGenerator printDefault(module);

  std::stringstream stream;
  stream << printDefault(built[0]);
  EXPECT_EQ(stream.str(), "(type $A (struct (field i32)))");

  stream.str("");
  stream << printDefault(built[1]);
  EXPECT_EQ(stream.str(), "(type $struct.0 (struct (field i32)))");

  using IndexedFallback = IndexedTypeNameGenerator<DefaultTypeNameGenerator>;
  IndexedTypeNameGenerator fallback(built);
  ModuleTypeNameGenerator<IndexedFallback> printIndexed(module, fallback);

  stream.str("");
  stream << printIndexed(built[0]);
  EXPECT_EQ(stream.str(), "(type $A (struct (field i32)))");

  stream.str("");
  stream << printIndexed(built[1]);
  EXPECT_EQ(stream.str(), "(type $1 (struct (field i32)))");
}